

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O2

void __thiscall
nonius::execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::execution_plan
          (execution_plan<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *this,
          int iterations_per_sample,duration<double,_std::ratio<1L,_1L>_> estimated_duration,
          parameters *params,benchmark_function *benchmark,
          duration<double,_std::ratio<1L,_1L>_> warmup_time,int warmup_iterations)

{
  _Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false> _Var1;
  undefined4 extraout_var;
  
  this->iterations_per_sample = iterations_per_sample;
  (this->estimated_duration).__r = estimated_duration.__r;
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)&this->params,
               (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nonius::param>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)params);
  _Var1._M_head_impl._0_4_ =
       (*((benchmark->f)._M_t.
          super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
          ._M_t.
          super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
          .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl)
         ->_vptr_concept[2])();
  _Var1._M_head_impl._4_4_ = extraout_var;
  (this->benchmark).f._M_t.
  super___uniq_ptr_impl<nonius::detail::benchmark_function::concept,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  ._M_t.
  super__Tuple_impl<0UL,_nonius::detail::benchmark_function::concept_*,_std::default_delete<nonius::detail::benchmark_function::concept>_>
  .super__Head_base<0UL,_nonius::detail::benchmark_function::concept_*,_false>._M_head_impl =
       _Var1._M_head_impl;
  (this->warmup_time).__r = warmup_time.__r;
  this->warmup_iterations = warmup_iterations;
  return;
}

Assistant:

execution_plan(int iterations_per_sample, Duration estimated_duration, parameters params, detail::benchmark_function benchmark, Duration warmup_time, int warmup_iterations)
            : iterations_per_sample(iterations_per_sample)
            , estimated_duration(estimated_duration)
            , params(params)
            , benchmark(benchmark)
            , warmup_time(warmup_time)
            , warmup_iterations(warmup_iterations)
        {}